

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ucase.cpp
# Opt level: O1

UBool ucase_isSoftDotted_63(UChar32 c)

{
  ushort uVar1;
  uint uVar2;
  ulong uVar3;
  
  if ((uint)c < 0xd800) {
    uVar2 = (uint)c >> 5;
  }
  else if ((uint)c < 0x10000) {
    uVar2 = ((uint)c >> 5) + 0x140;
    if (0xdbff < c) {
      uVar2 = (uint)c >> 5;
    }
  }
  else {
    uVar3 = 0xd30;
    if ((0x10ffff < (uint)c) || (uVar3 = 0x2f1c, 0xe07ff < c)) goto LAB_0032f1da;
    uVar2 = ((uint)c >> 5 & 0x3f) + (uint)ucase_props_trieIndex[(ulong)((uint)c >> 0xb) + 0x820];
  }
  uVar3 = (ulong)((c & 0x1fU) + (uint)ucase_props_trieIndex[uVar2] * 4);
LAB_0032f1da:
  uVar1 = ucase_props_trieIndex[uVar3];
  if ((uVar1 & 8) != 0) {
    uVar1 = ucase_props_exceptions[uVar1 >> 4] >> 7;
  }
  return (uVar1 & 0x60) == 0x20;
}

Assistant:

static inline int32_t
getDotType(UChar32 c) {
    uint16_t props=UTRIE2_GET16(&ucase_props_singleton.trie, c);
    if(!UCASE_HAS_EXCEPTION(props)) {
        return props&UCASE_DOT_MASK;
    } else {
        const uint16_t *pe=GET_EXCEPTIONS(&ucase_props_singleton, props);
        return (*pe>>UCASE_EXC_DOT_SHIFT)&UCASE_DOT_MASK;
    }
}